

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::Runner::runTests(Runner *this)

{
  bool bVar1;
  Config *this_00;
  RunContext *pRVar2;
  Ptr<Catch::Config> *in_RSI;
  Totals *in_RDI;
  size_t i;
  RunContext context;
  TestCaseFilters filterGroup;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  RunContext *in_stack_fffffffffffffca8;
  RunContext *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *in_stack_fffffffffffffcc0
  ;
  RunContext *this_01;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  byte bVar3;
  TestCaseFilters *this_02;
  string local_310 [8];
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *in_stack_fffffffffffffcf8
  ;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *in_stack_fffffffffffffd00
  ;
  string *in_stack_fffffffffffffd08;
  RunContext *in_stack_fffffffffffffd10;
  RunContext *in_stack_fffffffffffffd30;
  RunContext *local_2b0;
  Ptr<Catch::IStreamingReporter> *in_stack_fffffffffffffd60;
  Ptr<const_Catch::IConfig> *in_stack_fffffffffffffd68;
  RunContext *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  RunContext *in_stack_fffffffffffffd80;
  TestCaseFilters *in_stack_fffffffffffffda0;
  RunContext *in_stack_fffffffffffffda8;
  Runner *in_stack_fffffffffffffdb0;
  undefined1 local_a9 [137];
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> local_20;
  
  this_00 = Ptr<Catch::Config>::operator->(in_RSI);
  Config::filters(this_00);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  bVar1 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    (in_stack_fffffffffffffcc0);
  if (bVar1) {
    this_02 = (TestCaseFilters *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_a9 + 1),"",(allocator *)this_02);
    TestCaseFilters::TestCaseFilters
              (this_02,(string *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (in_stack_fffffffffffffcc0,
               (value_type *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    TestCaseFilters::~TestCaseFilters((TestCaseFilters *)in_stack_fffffffffffffcb0);
  }
  Ptr<Catch::Config>::get(in_RSI);
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffcb0,
             (IConfig *)in_stack_fffffffffffffca8);
  RunContext::RunContext
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffcb0);
  Totals::Totals((Totals *)in_stack_fffffffffffffcb0);
  local_2b0 = (RunContext *)0x0;
  while( true ) {
    this_01 = local_2b0;
    pRVar2 = (RunContext *)
             std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::size
                       (&local_20);
    bVar3 = 0;
    if (this_01 < pRVar2) {
      bVar1 = RunContext::aborting(in_stack_fffffffffffffcb0);
      bVar3 = bVar1 ^ 0xff;
    }
    if ((bVar3 & 1) == 0) break;
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::operator[]
              (&local_20,(size_type)local_2b0);
    TestCaseFilters::getName_abi_cxx11_((TestCaseFilters *)in_stack_fffffffffffffca8);
    in_stack_fffffffffffffcb0 = local_2b0;
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::size(&local_20);
    RunContext::testGroupStarting
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00
               ,(size_t)in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::operator[]
              (&local_20,(size_type)local_2b0);
    runTestsForGroup(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    Totals::operator+=((Totals *)in_stack_fffffffffffffcb0,(Totals *)in_stack_fffffffffffffca8);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::operator[]
              (&local_20,(size_type)local_2b0);
    TestCaseFilters::getName_abi_cxx11_((TestCaseFilters *)in_stack_fffffffffffffca8);
    in_stack_fffffffffffffca8 = local_2b0;
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::size(&local_20);
    RunContext::testGroupEnded
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (Totals *)in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68,
               (size_t)in_stack_fffffffffffffd60);
    std::__cxx11::string::~string(local_310);
    local_2b0 = (RunContext *)
                ((long)&(((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)
                         &local_2b0->super_IResultCapture)->
                        super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  RunContext::~RunContext(in_stack_fffffffffffffd30);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)this_01);
  return in_RDI;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config->filters();
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            for( std::size_t i=0; i < filterGroups.size() && !context.aborting(); ++i ) {
                context.testGroupStarting( filterGroups[i].getName(), i, filterGroups.size() );
                totals += runTestsForGroup( context, filterGroups[i] );
                context.testGroupEnded( filterGroups[i].getName(), totals, i, filterGroups.size() );
            }
            return totals;
        }